

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

mat33 * nifti_mat33_polar(mat33 A)

{
  mat33 R;
  mat33 A_00;
  mat33 R_00;
  mat33 R_01;
  mat33 A_01;
  mat33 A_02;
  mat33 A_03;
  mat33 A_04;
  mat33 *in_RDI;
  float fVar1;
  float fVar2;
  double dVar3;
  undefined4 in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  undefined1 local_94 [36];
  int local_70;
  float local_6c;
  int k;
  float dif;
  float gmi;
  float gam;
  float bet;
  float alp;
  mat33 Y;
  float fStack_2c;
  mat33 X;
  
  local_6c = 1.0;
  local_70 = 0;
  memcpy(Y.m[2] + 2,&stack0x00000008,0x24);
  R.m[0][1] = X.m[0][1];
  R.m[0][0] = X.m[0][0];
  R.m[1][0] = X.m[1][0];
  R.m[0][2] = X.m[0][2];
  R.m[1][2] = X.m[1][2];
  R.m[1][1] = X.m[1][1];
  R.m[2][0] = X.m[2][0];
  R.m[2][1] = (float)in_stack_ffffffffffffff4c;
  R.m[2][2] = in_stack_ffffffffffffff50;
  dif = nifti_mat33_determ(R);
  while ((dif == 0.0 && (!NAN(dif)))) {
    A_00.m[0][1] = X.m[0][1];
    A_00.m[0][0] = X.m[0][0];
    A_00.m[1][0] = X.m[1][0];
    A_00.m[0][2] = X.m[0][2];
    A_00.m[1][2] = X.m[1][2];
    A_00.m[1][1] = X.m[1][1];
    A_00.m[2][0] = X.m[2][0];
    A_00.m[2][1] = (float)in_stack_ffffffffffffff4c;
    A_00.m[2][2] = in_stack_ffffffffffffff50;
    fVar1 = nifti_mat33_rownorm(A_00);
    dif = (fVar1 + 0.001) * 1e-05;
    Y.m[2][2] = dif + Y.m[2][2];
    X.m[0][2] = dif + X.m[0][2];
    X.m[2][0] = dif + X.m[2][0];
    R_00.m[0][1] = X.m[0][1];
    R_00.m[0][0] = X.m[0][0];
    R_00.m[1][0] = X.m[1][0];
    R_00.m[0][2] = X.m[0][2];
    R_00.m[1][2] = X.m[1][2];
    R_00.m[1][1] = X.m[1][1];
    R_00.m[2][0] = X.m[2][0];
    R_00.m[2][1] = (float)in_stack_ffffffffffffff4c;
    R_00.m[2][2] = in_stack_ffffffffffffff50;
    dif = nifti_mat33_determ(R_00);
  }
  while( true ) {
    R_01.m[0][1] = X.m[0][1];
    R_01.m[0][0] = X.m[0][0];
    R_01.m[1][0] = X.m[1][0];
    R_01.m[0][2] = X.m[0][2];
    R_01.m[1][2] = X.m[1][2];
    R_01.m[1][1] = X.m[1][1];
    R_01.m[2][0] = X.m[2][0];
    R_01.m[2][1] = (float)in_stack_ffffffffffffff4c;
    R_01.m[2][2] = in_stack_ffffffffffffff50;
    nifti_mat33_inverse(R_01);
    memcpy(&bet,local_94,0x24);
    if (local_6c <= 0.3) {
      k = 0x3f800000;
      dif = 1.0;
    }
    else {
      A_01.m[0][1] = X.m[0][1];
      A_01.m[0][0] = X.m[0][0];
      A_01.m[1][0] = X.m[1][0];
      A_01.m[0][2] = X.m[0][2];
      A_01.m[1][2] = X.m[1][2];
      A_01.m[1][1] = X.m[1][1];
      A_01.m[2][0] = X.m[2][0];
      A_01.m[2][1] = (float)in_stack_ffffffffffffff4c;
      A_01.m[2][2] = in_stack_ffffffffffffff50;
      in_stack_ffffffffffffff50 = nifti_mat33_rownorm(A_01);
      A_02.m[0][1] = X.m[0][1];
      A_02.m[0][0] = X.m[0][0];
      A_02.m[1][0] = X.m[1][0];
      A_02.m[0][2] = X.m[0][2];
      A_02.m[1][2] = X.m[1][2];
      A_02.m[1][1] = X.m[1][1];
      A_02.m[2][0] = X.m[2][0];
      A_02.m[2][1] = (float)in_stack_ffffffffffffff4c;
      A_02.m[2][2] = in_stack_ffffffffffffff50;
      fVar1 = nifti_mat33_colnorm(A_02);
      dVar3 = sqrt((double)(in_stack_ffffffffffffff50 * fVar1));
      gam = (float)dVar3;
      A_03.m[0][1] = Y.m[0][1];
      A_03.m[0][0] = Y.m[0][0];
      A_03.m[1][0] = Y.m[1][0];
      A_03.m[0][2] = Y.m[0][2];
      A_03.m[1][2] = Y.m[1][2];
      A_03.m[1][1] = Y.m[1][1];
      A_03.m[2][0] = Y.m[2][0];
      A_03.m[2][1] = (float)in_stack_ffffffffffffff4c;
      A_03.m[2][2] = in_stack_ffffffffffffff50;
      fVar1 = nifti_mat33_rownorm(A_03);
      A_04.m[0][1] = Y.m[0][1];
      A_04.m[0][0] = Y.m[0][0];
      A_04.m[1][0] = Y.m[1][0];
      A_04.m[0][2] = Y.m[0][2];
      A_04.m[1][2] = Y.m[1][2];
      A_04.m[1][1] = Y.m[1][1];
      A_04.m[2][0] = Y.m[2][0];
      A_04.m[2][1] = (float)in_stack_ffffffffffffff4c;
      A_04.m[2][2] = in_stack_ffffffffffffff50;
      fVar2 = nifti_mat33_colnorm(A_04);
      dVar3 = sqrt((double)(fVar1 * fVar2));
      gmi = (float)dVar3;
      dVar3 = sqrt((double)(gmi / gam));
      dif = (float)dVar3;
      k = (int)(1.0 / dif);
    }
    in_RDI->m[0][0] = (dif * Y.m[2][2] + (float)k * bet) * 0.5;
    in_RDI->m[0][1] = (dif * fStack_2c + (float)k * Y.m[0][1]) * 0.5;
    in_RDI->m[0][2] = (dif * X.m[0][0] + (float)k * Y.m[1][1]) * 0.5;
    in_RDI->m[1][0] = (dif * X.m[0][1] + (float)k * alp) * 0.5;
    in_RDI->m[1][1] = (dif * X.m[0][2] + (float)k * Y.m[0][2]) * 0.5;
    in_RDI->m[1][2] = (dif * X.m[1][0] + (float)k * Y.m[1][2]) * 0.5;
    in_RDI->m[2][0] = (dif * X.m[1][1] + (float)k * Y.m[0][0]) * 0.5;
    in_RDI->m[2][1] = (dif * X.m[1][2] + (float)k * Y.m[1][0]) * 0.5;
    in_RDI->m[2][2] = (dif * X.m[2][0] + (float)k * Y.m[2][0]) * 0.5;
    local_6c = ABS(in_RDI->m[0][0] - Y.m[2][2]) + ABS(in_RDI->m[0][1] - fStack_2c) +
               ABS(in_RDI->m[0][2] - X.m[0][0]) + ABS(in_RDI->m[1][0] - X.m[0][1]) +
               ABS(in_RDI->m[1][1] - X.m[0][2]) + ABS(in_RDI->m[1][2] - X.m[1][0]) +
               ABS(in_RDI->m[2][0] - X.m[1][1]) + ABS(in_RDI->m[2][1] - X.m[1][2]) +
               ABS(in_RDI->m[2][2] - X.m[2][0]);
    local_70 = local_70 + 1;
    if ((100 < local_70) || (local_6c < 3e-06)) break;
    memcpy(Y.m[2] + 2,in_RDI,0x24);
  }
  return in_RDI;
}

Assistant:

mat33 nifti_mat33_polar( mat33 A )
{
   mat33 X , Y , Z ;
   float alp,bet,gam,gmi , dif=1.0f ;
   int k=0 ;

   X = A ;

   /* force matrix to be nonsingular */

   gam = nifti_mat33_determ(X) ;
   while( gam == 0.0 ){        /* perturb matrix */
     gam = (float)( 0.00001 * ( 0.001 + nifti_mat33_rownorm(X) ) ) ;
     X.m[0][0] += gam ; X.m[1][1] += gam ; X.m[2][2] += gam ;
     gam = nifti_mat33_determ(X) ;
   }

   while(1){
     Y = nifti_mat33_inverse(X) ;
     if( dif > 0.3 ){     /* far from convergence */
       alp = (float)( sqrt( nifti_mat33_rownorm(X) * nifti_mat33_colnorm(X) ) ) ;
       bet = (float)( sqrt( nifti_mat33_rownorm(Y) * nifti_mat33_colnorm(Y) ) ) ;
       gam = (float)( sqrt( bet / alp ) ) ;
       gmi = (float)( 1.0 / gam ) ;
     } else {
       gam = gmi = 1.0f ;  /* close to convergence */
     }
     Z.m[0][0] = (float)( 0.5 * ( gam*X.m[0][0] + gmi*Y.m[0][0] ) ) ;
     Z.m[0][1] = (float)( 0.5 * ( gam*X.m[0][1] + gmi*Y.m[1][0] ) ) ;
     Z.m[0][2] = (float)( 0.5 * ( gam*X.m[0][2] + gmi*Y.m[2][0] ) ) ;
     Z.m[1][0] = (float)( 0.5 * ( gam*X.m[1][0] + gmi*Y.m[0][1] ) ) ;
     Z.m[1][1] = (float)( 0.5 * ( gam*X.m[1][1] + gmi*Y.m[1][1] ) ) ;
     Z.m[1][2] = (float)( 0.5 * ( gam*X.m[1][2] + gmi*Y.m[2][1] ) ) ;
     Z.m[2][0] = (float)( 0.5 * ( gam*X.m[2][0] + gmi*Y.m[0][2] ) ) ;
     Z.m[2][1] = (float)( 0.5 * ( gam*X.m[2][1] + gmi*Y.m[1][2] ) ) ;
     Z.m[2][2] = (float)( 0.5 * ( gam*X.m[2][2] + gmi*Y.m[2][2] ) ) ;

     dif = (float)( fabs(Z.m[0][0]-X.m[0][0])+fabs(Z.m[0][1]-X.m[0][1])
          +fabs(Z.m[0][2]-X.m[0][2])+fabs(Z.m[1][0]-X.m[1][0])
          +fabs(Z.m[1][1]-X.m[1][1])+fabs(Z.m[1][2]-X.m[1][2])
          +fabs(Z.m[2][0]-X.m[2][0])+fabs(Z.m[2][1]-X.m[2][1])
          +fabs(Z.m[2][2]-X.m[2][2])                          );

     k = k+1 ;
     if( k > 100 || dif < 3.e-6 ) break ;  /* convergence or exhaustion */
     X = Z ;
   }

   return Z ;
}